

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFileBaseNameArtifact<ArtifactLinkerTag>::Evaluate
          (string *__return_storage_ptr__,TargetFileBaseNameArtifact<ArtifactLinkerTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  cmGeneratorTarget *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  string local_38;
  
  this_00 = TargetArtifactBase::GetTarget
                      (&this->super_TargetArtifactBase,parameters,context,content,dagChecker);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    TargetOutputNameArtifactResultGetter<ArtifactLinkerTag>::Get_abi_cxx11_
              (&local_38,(TargetOutputNameArtifactResultGetter<ArtifactLinkerTag> *)this_00,
               (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,
               (GeneratorExpressionContent *)dagChecker);
    bVar2 = context->HadError;
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    if (bVar2 == true) {
      psVar4 = &__return_storage_ptr__->_M_string_length;
      paVar3 = paVar1;
    }
    else {
      paVar3 = &local_38.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == paVar3) {
        paVar1->_M_allocated_capacity = local_38.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_38.field_2._M_allocated_capacity;
      }
      psVar4 = &local_38._M_string_length;
      __return_storage_ptr__->_M_string_length = local_38._M_string_length;
      local_38._M_dataplus._M_p = (pointer)paVar3;
    }
    *psVar4 = 0;
    paVar3->_M_local_buf[0] = '\0';
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    cmGeneratorTarget* target =
      this->GetTarget(parameters, context, content, dagChecker);
    if (!target) {
      return std::string();
    }

    std::string result = TargetOutputNameArtifactResultGetter<ArtifactT>::Get(
      target, context, content);
    if (context->HadError) {
      return std::string();
    }
    return result;
  }